

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O0

void print_mem_ppr_status(igsc_ppr_status *sts)

{
  char *pcVar1;
  uint local_14;
  uint32_t i;
  igsc_ppr_status *sts_local;
  
  printf("PPR status:\n");
  printf("Boot time memory correction pending: %u\n",(ulong)sts->boot_time_memory_correction_pending
        );
  if (sts->ppr_mode < 4) {
    printf("PPR mode: %s\n",gfsp_ppr_mode_str[sts->ppr_mode]);
  }
  else {
    printf("PPR mode: %u\n",(ulong)sts->ppr_mode);
  }
  pcVar1 = "Test executed";
  if ((sts->test_run_status & 1) != 0) {
    pcVar1 = "Test not executed";
  }
  printf("Test run status: executed: %s\n",pcVar1);
  pcVar1 = "Test finished successfully";
  if ((sts->test_run_status & 2) != 0) {
    pcVar1 = "Error occurred during test execution";
  }
  printf("Test run status: finished successfully: %s\n",pcVar1);
  pcVar1 = "HW error not found";
  if ((sts->test_run_status & 4) != 0) {
    pcVar1 = "HW error found";
  }
  printf("Test run status: found hw error: %s\n",pcVar1);
  pcVar1 = "HW error repaired or no HW error found";
  if ((sts->test_run_status & 8) != 0) {
    pcVar1 = "HW error is unrepairable";
  }
  printf("Test run status: hw error repaired: %s\n",pcVar1);
  if (sts->ras_ppr_applied < 3) {
    printf("RAS PPR test applied: %s\n",gfsp_ppr_applied_str[sts->ras_ppr_applied]);
  }
  else {
    printf("RAS PPR test applied: %u\n",(ulong)sts->ras_ppr_applied);
  }
  printf("mbist completed: %u\n",(ulong)sts->mbist_completed);
  printf("Number of PPR devices: %u\n",(ulong)sts->num_devices);
  for (local_14 = 0; local_14 < sts->num_devices; local_14 = local_14 + 1) {
    printf("Device[%u]:\n",(ulong)local_14);
    printf("\t mbist test status: %u\n",
           (ulong)*(uint *)(&sts[1].boot_time_memory_correction_pending + (ulong)local_14 * 0xc));
    printf("\t Number of PPR fuses used by fw: %u\n",
           (ulong)(&sts[1].ras_ppr_applied)[(ulong)local_14 * 3]);
    printf("\t Number of remaining PPR fuses: %u\n",
           (ulong)(&sts[1].mbist_completed)[(ulong)local_14 * 3]);
  }
  return;
}

Assistant:

void print_mem_ppr_status(struct igsc_ppr_status *sts)
{
    printf("PPR status:\n");
    printf("Boot time memory correction pending: %u\n",
           sts->boot_time_memory_correction_pending);
    if (sizeof(gfsp_ppr_mode_str)/sizeof(char*) <= sts->ppr_mode)
        printf("PPR mode: %u\n", sts->ppr_mode);
    else
        printf("PPR mode: %s\n", gfsp_ppr_mode_str[sts->ppr_mode]);
    printf("Test run status: executed: %s\n",
           (sts->test_run_status & IGSC_PPR_STATUS_TEST_EXECUTED_MASK) ? "Test not executed" : "Test executed");
    printf("Test run status: finished successfully: %s\n",
           (sts->test_run_status & IGSC_PPR_STATUS_TEST_SUCCESS_MASK) ? "Error occurred during test execution" : "Test finished successfully");
    printf("Test run status: found hw error: %s\n",
           (sts->test_run_status & IGSC_PPR_STATUS_FOUND_HW_ERROR_MASK) ? "HW error found" : "HW error not found");
    printf("Test run status: hw error repaired: %s\n",
           (sts->test_run_status & IGSC_PPR_STATUS_HW_ERROR_REPAIRED_MASK) ? "HW error is unrepairable" : "HW error repaired or no HW error found");
    if (sizeof(gfsp_ppr_applied_str)/sizeof(char*) <= sts->ras_ppr_applied)
        printf("RAS PPR test applied: %u\n", sts->ras_ppr_applied);
    else
        printf("RAS PPR test applied: %s\n", gfsp_ppr_applied_str[sts->ras_ppr_applied]);
    printf("mbist completed: %u\n", sts->mbist_completed);
    printf("Number of PPR devices: %u\n", sts->num_devices);

    for (uint32_t i = 0; i < sts->num_devices; i++)
    {
        printf("Device[%u]:\n", i);
        printf("\t mbist test status: %u\n",
               sts->device_mbist_ppr_status[i].mbist_test_status);
        printf("\t Number of PPR fuses used by fw: %u\n",
               sts->device_mbist_ppr_status[i].num_of_ppr_fuses_used_by_fw);
        printf("\t Number of remaining PPR fuses: %u\n",
               sts->device_mbist_ppr_status[i].num_of_remaining_ppr_fuses);
    }
}